

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_throw(lua_State *L,int errcode)

{
  global_State *pgVar1;
  lua_State *plVar2;
  StkId pSVar3;
  long lVar4;
  int errcode_00;
  undefined8 *puVar5;
  
  if (L->errorJmp != (lua_longjmp *)0x0) {
    L->errorJmp->status = errcode;
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = L->errorJmp;
    __cxa_throw(puVar5,&lua_longjmp*::typeinfo,0);
  }
  pgVar1 = L->l_G;
  errcode_00 = luaE_resetthread(L,errcode);
  plVar2 = pgVar1->mainthread;
  if (plVar2->errorJmp == (lua_longjmp *)0x0) {
    if (pgVar1->panic != (lua_CFunction)0x0) {
      (*pgVar1->panic)(L);
    }
    abort();
  }
  pSVar3 = (plVar2->top).p;
  (plVar2->top).p = pSVar3 + 1;
  lVar4 = (L->top).offset;
  (pSVar3->val).value_ = *(Value *)(lVar4 + -0x10);
  (pSVar3->val).tt_ = *(lu_byte *)(lVar4 + -8);
  luaD_throw(pgVar1->mainthread,errcode_00);
}

Assistant:

l_noret luaD_throw (lua_State *L, int errcode) {
  if (L->errorJmp) {  /* thread has an error handler? */
    L->errorJmp->status = errcode;  /* set status */
    LUAI_THROW(L, L->errorJmp);  /* jump to it */
  }
  else {  /* thread has no error handler */
    global_State *g = G(L);
    errcode = luaE_resetthread(L, errcode);  /* close all upvalues */
    if (g->mainthread->errorJmp) {  /* main thread has a handler? */
      setobjs2s(L, g->mainthread->top.p++, L->top.p - 1);  /* copy error obj. */
      luaD_throw(g->mainthread, errcode);  /* re-throw in main thread */
    }
    else {  /* no handler at all; abort */
      if (g->panic) {  /* panic function? */
        lua_unlock(L);
        g->panic(L);  /* call panic function (last chance to jump out) */
      }
      abort();
    }
  }
}